

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_diff.c
# Opt level: O0

int byte_diff(char *s,uint n,char *t)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *local_28;
  char *t_local;
  byte *pbStack_18;
  uint n_local;
  char *s_local;
  
  local_28 = (byte *)t;
  t_local._4_4_ = n;
  pbStack_18 = (byte *)s;
  while( true ) {
    if (t_local._4_4_ == 0) {
      return 0;
    }
    pbVar1 = local_28;
    pbVar2 = pbStack_18;
    if (*pbStack_18 != *local_28) break;
    if (t_local._4_4_ == 1) {
      return 0;
    }
    pbVar1 = local_28 + 1;
    pbVar2 = pbStack_18 + 1;
    if (pbStack_18[1] != local_28[1]) break;
    if (t_local._4_4_ == 2) {
      return 0;
    }
    pbVar1 = local_28 + 2;
    pbVar2 = pbStack_18 + 2;
    if (pbStack_18[2] != local_28[2]) break;
    if (t_local._4_4_ == 3) {
      return 0;
    }
    pbVar1 = local_28 + 3;
    pbVar2 = pbStack_18 + 3;
    if (pbStack_18[3] != local_28[3]) break;
    pbStack_18 = pbStack_18 + 4;
    local_28 = local_28 + 4;
    t_local._4_4_ = t_local._4_4_ - 4;
  }
  pbStack_18 = pbVar2;
  local_28 = pbVar1;
  return (uint)*pbStack_18 - (uint)*local_28;
}

Assistant:

int byte_diff(s,n,t)
register char *s;
register unsigned int n;
register char *t;
{
  for (;;) {
    if (!n) return 0; if (*s != *t) break; ++s; ++t; --n;
    if (!n) return 0; if (*s != *t) break; ++s; ++t; --n;
    if (!n) return 0; if (*s != *t) break; ++s; ++t; --n;
    if (!n) return 0; if (*s != *t) break; ++s; ++t; --n;
  }
  return ((int)(unsigned int)(unsigned char) *s)
       - ((int)(unsigned int)(unsigned char) *t);
}